

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O3

int __thiscall libnbt::NBTTagList::remove(NBTTagList *this,char *__filename)

{
  pointer ppNVar1;
  pointer ppNVar2;
  pointer __src;
  char *pcVar3;
  
  ppNVar1 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
            super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
            super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pcVar3 = (char *)((long)ppNVar2 - (long)ppNVar1 >> 3);
  if (__filename < pcVar3) {
    if (ppNVar1[(long)__filename] != (NBTBase *)0x0) {
      (*ppNVar1[(long)__filename]->_vptr_NBTBase[5])();
      ppNVar1 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar2 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    __src = ppNVar1 + (long)(__filename + 1);
    if (__src != ppNVar2) {
      ppNVar1 = (pointer)memmove(ppNVar1 + (long)__filename,__src,(long)ppNVar2 - (long)__src);
      ppNVar2 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
    super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar2 + -1;
  }
  return (int)CONCAT71((int7)((ulong)ppNVar1 >> 8),__filename < pcVar3);
}

Assistant:

bool NBTTagList::remove(size_t index) {
        if (index < array.size()) {
            delete (array[index]);
            array.erase(array.begin() + index);
            return true;
        }
        return false;
    }